

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O3

void fallbackSort(UInt32 *fmap,UInt32 *eclass,UInt32 *bhtab,Int32 nblock,Int32 verb)

{
  uint uVar1;
  undefined4 uVar2;
  UInt32 UVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  UInt32 *pUVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  UInt32 UVar25;
  long lVar26;
  Int32 zztmp;
  Int32 zztmp_1;
  ulong uVar27;
  uint uVar28;
  Int32 stackLo [100];
  Int32 ftab [257];
  Int32 ftabCopy [256];
  ulong local_bb8;
  ulong local_b98;
  uint local_b88;
  uint local_b68 [99];
  uint auStack_9dc [101];
  int local_848 [260];
  int local_438 [258];
  
  if (3 < verb) {
    fallbackSort_cold_1();
  }
  uVar6 = (ulong)(uint)nblock;
  memset(local_848,0,0x404);
  iVar16 = 0;
  if (0 < nblock) {
    uVar10 = 0;
    do {
      local_848[*(byte *)((long)eclass + uVar10)] = local_848[*(byte *)((long)eclass + uVar10)] + 1;
      uVar10 = uVar10 + 1;
      iVar16 = local_848[0];
    } while (uVar6 != uVar10);
  }
  memcpy(local_438,local_848,0x400);
  lVar11 = 1;
  do {
    iVar16 = iVar16 + local_848[lVar11];
    local_848[lVar11] = iVar16;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x101);
  if (0 < nblock) {
    uVar10 = 0;
    do {
      iVar16 = local_848[*(byte *)((long)eclass + uVar10)];
      local_848[*(byte *)((long)eclass + uVar10)] = iVar16 + -1;
      fmap[(long)iVar16 + -1] = (UInt32)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
  }
  if (-0x40 < nblock) {
    iVar16 = nblock + 0x1f;
    if (-1 < nblock) {
      iVar16 = nblock;
    }
    memset(bhtab,0,(ulong)((iVar16 >> 5) + 1) * 4 + 4);
  }
  lVar11 = 0;
  do {
    bhtab[local_848[lVar11] >> 5] =
         bhtab[local_848[lVar11] >> 5] | 1 << ((byte)local_848[lVar11] & 0x1f);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x100);
  iVar16 = 0;
  do {
    bhtab[nblock + iVar16 >> 5] =
         bhtab[nblock + iVar16 >> 5] | 1 << ((byte)(nblock + iVar16) & 0x1f);
    iVar14 = nblock + 1 + iVar16;
    bVar5 = (byte)iVar14 & 0x1f;
    bhtab[iVar14 >> 5] = bhtab[iVar14 >> 5] & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
    iVar16 = iVar16 + 2;
  } while (iVar16 != 0x40);
  iVar16 = 1;
LAB_00745d96:
  do {
    if (3 < verb) {
      fprintf(_stderr,"        depth %6d has ");
    }
    if (0 < nblock) {
      uVar10 = 0;
      uVar15 = 0;
      do {
        if ((bhtab[uVar10 >> 5 & 0x7ffffff] >> ((uint)uVar10 & 0x1f) & 1) != 0) {
          uVar15 = uVar10 & 0xffffffff;
        }
        eclass[(int)(((int)(fmap[uVar10] - iVar16) >> 0x1f & nblock) + (fmap[uVar10] - iVar16))] =
             (UInt32)uVar15;
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
    }
    uVar28 = 0;
    local_b98 = 0;
LAB_00745de9:
    iVar14 = uVar28 - 0x20;
    uVar9 = uVar28 - 1;
    do {
      uVar1 = uVar9;
      iVar22 = iVar14;
      uVar8 = uVar28;
      uVar7 = 1 << (sbyte)(uVar8 & 0x1f) & bhtab[(int)uVar8 >> 5];
      if ((uVar8 & 0x1f) == 0) break;
      uVar28 = uVar8 + 1;
      iVar14 = iVar22 + 1;
      uVar9 = uVar1 + 1;
    } while (uVar7 != 0);
    if (uVar7 != 0) {
      do {
        uVar8 = uVar1;
        iVar22 = iVar22 + 0x20;
        uVar1 = uVar8 + 0x20;
      } while (bhtab[iVar22 >> 5] == 0xffffffff);
      do {
        uVar8 = uVar8 + 1;
      } while ((bhtab[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0);
    }
    if ((int)uVar8 <= nblock) {
      uVar7 = uVar8 - 1;
      iVar14 = uVar8 - 0x20;
      uVar9 = uVar7;
      uVar1 = uVar8;
      do {
        uVar28 = uVar1;
        uVar18 = uVar9;
        iVar22 = iVar14;
        uVar23 = 1 << ((byte)uVar28 & 0x1f) & bhtab[(int)uVar28 >> 5];
        if ((uVar28 & 0x1f) == 0) break;
        iVar14 = iVar22 + 1;
        uVar9 = uVar18 + 1;
        uVar1 = uVar28 + 1;
      } while (uVar23 == 0);
      if (uVar23 == 0) {
        do {
          uVar28 = uVar18;
          iVar22 = iVar22 + 0x20;
          uVar18 = uVar28 + 0x20;
        } while (bhtab[iVar22 >> 5] == 0);
        do {
          uVar28 = uVar28 + 1;
        } while ((bhtab[(int)uVar28 >> 5] >> (uVar28 & 0x1f) & 1) == 0);
      }
      if (nblock < (int)uVar28) goto LAB_007462fc;
      if ((int)uVar8 < (int)uVar28) {
        local_b98 = (ulong)(((int)local_b98 - uVar8) + uVar28 + 1);
        auStack_9dc[1] = uVar7;
        local_b68[0] = uVar28 - 1;
        uVar10 = 1;
        local_b88 = 0;
        do {
          uVar15 = uVar10 & 0xffffffff;
          while( true ) {
            if (0x62 < uVar15) {
              BZ2_bz__AssertH__fail(0x3ec);
            }
            uVar10 = uVar15 - 1;
            uVar9 = auStack_9dc[uVar15];
            lVar11 = (long)(int)uVar9;
            uVar1 = local_b68[uVar15 - 1];
            if (9 < (int)(uVar1 - uVar9)) break;
            if (uVar1 != uVar9) {
              lVar17 = (long)(int)uVar1;
              if ((int)uVar9 <= (int)(uVar1 - 4) && 3 < (int)(uVar1 - uVar9)) {
                lVar12 = lVar17;
                uVar27 = (long)(int)(uVar1 - 4);
                do {
                  UVar25 = fmap[uVar27];
                  if (lVar17 + -4 < (long)uVar27) {
                    uVar18 = (uint)uVar27;
                  }
                  else {
                    uVar8 = eclass[(int)UVar25];
                    uVar19 = uVar27 & 0xffffffff;
                    lVar26 = lVar12;
                    do {
                      uVar18 = (uint)uVar19;
                      if (uVar8 <= eclass[fmap[lVar26]]) break;
                      fmap[(int)uVar18] = fmap[lVar26];
                      lVar26 = lVar26 + 4;
                      uVar18 = uVar18 + 4;
                      uVar19 = (ulong)uVar18;
                    } while (lVar26 <= lVar17);
                  }
                  fmap[(int)uVar18] = UVar25;
                  lVar12 = lVar12 + -1;
                  bVar4 = lVar11 < (long)uVar27;
                  uVar27 = uVar27 - 1;
                } while (bVar4);
              }
              if ((int)uVar9 < (int)uVar1) {
                iVar14 = -uVar1;
                pUVar20 = fmap + lVar17;
                iVar22 = 1;
                lVar12 = lVar17;
                do {
                  UVar25 = fmap[lVar12 + -1];
                  iVar24 = (int)lVar12;
                  if (lVar12 <= lVar17) {
                    uVar9 = eclass[(int)UVar25];
                    lVar26 = 0;
                    do {
                      if (uVar9 <= eclass[pUVar20[lVar26]]) {
                        iVar24 = (int)lVar26 - iVar14;
                        break;
                      }
                      pUVar20[lVar26 + -1] = pUVar20[lVar26];
                      lVar26 = lVar26 + 1;
                      iVar24 = uVar1 + 1;
                    } while (iVar22 != (int)lVar26);
                  }
                  lVar12 = lVar12 + -1;
                  fmap[(long)iVar24 + -1] = UVar25;
                  iVar14 = iVar14 + 1;
                  iVar22 = iVar22 + 1;
                  pUVar20 = pUVar20 + -1;
                } while (lVar11 < lVar12);
              }
            }
            bVar4 = (long)uVar15 < 2;
            uVar15 = uVar10;
            if (bVar4) goto LAB_007462aa;
          }
          local_b88 = local_b88 * 0x1dc5 + 1 & 0x7fff;
          uVar8 = uVar9;
          if (((short)(local_b88 % 3) != 0) && (uVar8 = uVar1, local_b88 % 3 == 1)) {
            uVar8 = (int)(uVar1 + uVar9) >> 1;
          }
          UVar25 = eclass[fmap[(int)uVar8]];
          local_bb8 = (ulong)uVar1;
          uVar27 = (ulong)uVar9;
          uVar8 = uVar1;
          uVar18 = uVar9;
LAB_007460aa:
          uVar23 = uVar18;
          if ((int)uVar18 <= (int)uVar8) {
            uVar27 = (ulong)(int)uVar27;
            do {
              lVar17 = (long)(int)uVar18 + -1;
              uVar23 = uVar18;
              while( true ) {
                uVar21 = fmap[lVar17 + 1];
                UVar3 = eclass[uVar21];
                if (UVar3 == UVar25) break;
                if (UVar3 != UVar25 && (int)UVar25 <= (int)UVar3) goto LAB_00746119;
                uVar23 = uVar23 + 1;
                lVar17 = lVar17 + 1;
                if ((int)uVar8 <= lVar17) {
                  if ((int)uVar18 <= (int)uVar8) {
                    uVar18 = uVar8;
                  }
                  uVar23 = uVar18 + 1;
                  goto LAB_00746119;
                }
              }
              fmap[lVar17 + 1] = fmap[uVar27];
              fmap[uVar27] = uVar21;
              uVar27 = uVar27 + 1;
              uVar18 = uVar23 + 1;
            } while ((int)uVar23 < (int)uVar8);
            uVar23 = uVar23 + 1;
          }
LAB_00746119:
          lVar17 = (long)(int)uVar23;
          if ((int)uVar23 <= (int)uVar8) {
            local_bb8 = (ulong)(int)local_bb8;
            do {
              lVar12 = (long)(int)uVar8 + 1;
              uVar21 = uVar8;
              while( true ) {
                uVar18 = fmap[lVar12 + -1];
                if (eclass[uVar18] == UVar25) break;
                if ((int)eclass[uVar18] < (int)UVar25) {
                  UVar3 = fmap[lVar17];
                  fmap[lVar17] = uVar18;
                  fmap[lVar12 + -1] = UVar3;
                  uVar18 = uVar23 + 1;
                  uVar8 = uVar21 - 1;
                  goto LAB_007460aa;
                }
                lVar12 = lVar12 + -1;
                uVar21 = uVar21 - 1;
                if (lVar12 <= lVar17) {
                  uVar21 = uVar8;
                  if (lVar17 <= (int)uVar8) {
                    uVar21 = uVar23;
                  }
                  goto LAB_007461b1;
                }
              }
              fmap[lVar12 + -1] = fmap[local_bb8];
              fmap[local_bb8] = uVar18;
              local_bb8 = local_bb8 - 1;
              uVar8 = uVar21 - 1;
            } while ((int)uVar23 < (int)uVar21);
LAB_007461b1:
            uVar8 = uVar21 - 1;
          }
          uVar18 = (uint)uVar27;
          if ((int)uVar18 <= (int)local_bb8) {
            iVar14 = uVar23 - uVar18;
            if ((int)(uVar18 - uVar9) < (int)(uVar23 - uVar18)) {
              iVar14 = uVar18 - uVar9;
            }
            if (0 < iVar14) {
              uVar21 = iVar14 + 1;
              lVar12 = 0;
              do {
                uVar2 = *(undefined4 *)((long)fmap + lVar12 + lVar11 * 4);
                *(undefined4 *)((long)fmap + lVar12 + lVar11 * 4) =
                     *(undefined4 *)((long)fmap + lVar12 + (long)(int)(uVar23 - iVar14) * 4);
                *(undefined4 *)((long)fmap + lVar12 + (long)(int)(uVar23 - iVar14) * 4) = uVar2;
                lVar12 = lVar12 + 4;
                uVar21 = uVar21 - 1;
              } while (1 < uVar21);
            }
            iVar22 = (int)local_bb8 - uVar8;
            iVar14 = uVar1 - (int)local_bb8;
            if (iVar22 <= (int)(uVar1 - (int)local_bb8)) {
              iVar14 = iVar22;
            }
            if (0 < iVar14) {
              uVar8 = iVar14 + 1;
              pUVar20 = fmap;
              do {
                UVar25 = pUVar20[lVar17];
                pUVar20[lVar17] = pUVar20[(long)(int)(uVar1 - iVar14) + 1];
                pUVar20[(long)(int)(uVar1 - iVar14) + 1] = UVar25;
                pUVar20 = pUVar20 + 1;
                uVar8 = uVar8 - 1;
              } while (1 < uVar8);
            }
            uVar8 = uVar9 + ~uVar18 + uVar23;
            uVar21 = (uVar1 - iVar22) + 1;
            if ((int)(uVar1 - uVar21) < (int)(~uVar18 + uVar23)) {
              local_b68[uVar10] = uVar8;
              uVar8 = uVar1;
              uVar9 = uVar21;
            }
            else {
              auStack_9dc[uVar15] = uVar21;
            }
            auStack_9dc[(uVar15 & 0xffffffff) + 1] = uVar9;
            local_b68[uVar15 & 0xffffffff] = uVar8;
            uVar10 = (ulong)((int)uVar15 + 1);
          }
        } while (0 < (int)uVar10);
LAB_007462aa:
        puVar13 = fmap + (int)uVar7;
        UVar25 = 0xffffffff;
        do {
          UVar3 = eclass[*puVar13];
          if (UVar25 != UVar3) {
            bhtab[(int)uVar7 >> 5] = bhtab[(int)uVar7 >> 5] | 1 << ((byte)uVar7 & 0x1f);
            UVar25 = UVar3;
          }
          uVar7 = uVar7 + 1;
          puVar13 = puVar13 + 1;
        } while (uVar28 != uVar7);
      }
      goto LAB_00745de9;
    }
LAB_007462fc:
    if (3 < verb) {
      fprintf(_stderr,"%6d unresolved strings\n",local_b98);
      iVar16 = iVar16 * 2;
      if ((nblock < iVar16) || ((int)local_b98 == 0)) {
        fallbackSort_cold_2();
LAB_00746397:
        if (0 < nblock) {
          uVar10 = 0;
          lVar11 = 0;
          do {
            lVar11 = (long)(int)lVar11 + -1;
            do {
              lVar17 = lVar11 + 1;
              lVar11 = lVar11 + 1;
            } while (local_438[lVar17] == 0);
            local_438[lVar11] = local_438[lVar17] + -1;
            *(char *)((long)eclass + (ulong)fmap[uVar10]) = (char)lVar11;
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar6);
          if (0xff < lVar11) {
            BZ2_bz__AssertH__fail(0x3ed);
            return;
          }
        }
        return;
      }
      goto LAB_00745d96;
    }
    iVar16 = iVar16 * 2;
    if ((nblock < iVar16) || ((int)local_b98 == 0)) goto LAB_00746397;
  } while( true );
}

Assistant:

static
void fallbackSort ( UInt32* fmap, 
                    UInt32* eclass, 
                    UInt32* bhtab,
                    Int32   nblock,
                    Int32   verb )
{
   Int32 ftab[257];
   Int32 ftabCopy[256];
   Int32 H, i, j, k, l, r, cc, cc1;
   Int32 nNotDone;
   Int32 nBhtab;
   UChar* eclass8 = (UChar*)eclass;

   /*--
      Initial 1-char radix sort to generate
      initial fmap and initial BH bits.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        bucket sorting ...\n" );
   for (i = 0; i < 257;    i++) ftab[i] = 0;
   for (i = 0; i < nblock; i++) ftab[eclass8[i]]++;
   for (i = 0; i < 256;    i++) ftabCopy[i] = ftab[i];
   for (i = 1; i < 257;    i++) ftab[i] += ftab[i-1];

   for (i = 0; i < nblock; i++) {
      j = eclass8[i];
      k = ftab[j] - 1;
      ftab[j] = k;
      fmap[k] = i;
   }

   nBhtab = 2 + (nblock / 32);
   for (i = 0; i < nBhtab; i++) bhtab[i] = 0;
   for (i = 0; i < 256; i++) SET_BH(ftab[i]);

   /*--
      Inductively refine the buckets.  Kind-of an
      "exponential radix sort" (!), inspired by the
      Manber-Myers suffix array construction algorithm.
   --*/

   /*-- set sentinel bits for block-end detection --*/
   for (i = 0; i < 32; i++) { 
      SET_BH(nblock + 2*i);
      CLEAR_BH(nblock + 2*i + 1);
   }

   /*-- the log(N) loop --*/
   H = 1;
   while (1) {

      if (verb >= 4) 
         VPrintf1 ( "        depth %6d has ", H );

      j = 0;
      for (i = 0; i < nblock; i++) {
         if (ISSET_BH(i)) j = i;
         k = fmap[i] - H; if (k < 0) k += nblock;
         eclass[k] = j;
      }

      nNotDone = 0;
      r = -1;
      while (1) {

	 /*-- find the next non-singleton bucket --*/
         k = r + 1;
         while (ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (ISSET_BH(k)) {
            while (WORD_BH(k) == 0xffffffff) k += 32;
            while (ISSET_BH(k)) k++;
         }
         l = k - 1;
         if (l >= nblock) break;
         while (!ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (!ISSET_BH(k)) {
            while (WORD_BH(k) == 0x00000000) k += 32;
            while (!ISSET_BH(k)) k++;
         }
         r = k - 1;
         if (r >= nblock) break;

         /*-- now [l, r] bracket current bucket --*/
         if (r > l) {
            nNotDone += (r - l + 1);
            fallbackQSort3 ( fmap, eclass, l, r );

            /*-- scan bucket and generate header bits-- */
            cc = -1;
            for (i = l; i <= r; i++) {
               cc1 = eclass[fmap[i]];
               if (cc != cc1) { SET_BH(i); cc = cc1; };
            }
         }
      }

      if (verb >= 4) 
         VPrintf1 ( "%6d unresolved strings\n", nNotDone );

      H *= 2;
      if (H > nblock || nNotDone == 0) break;
   }

   /*-- 
      Reconstruct the original block in
      eclass8 [0 .. nblock-1], since the
      previous phase destroyed it.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        reconstructing block ...\n" );
   j = 0;
   for (i = 0; i < nblock; i++) {
      while (ftabCopy[j] == 0) j++;
      ftabCopy[j]--;
      eclass8[fmap[i]] = (UChar)j;
   }
   AssertH ( j < 256, 1005 );
}